

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_test.cc
# Opt level: O0

void __thiscall
CipherTest_SHA256WithSecretSuffix_Test::TestBody(CipherTest_SHA256WithSecretSuffix_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_2d8;
  Message local_2d0;
  Span<const_unsigned_char> local_2c8;
  Bytes local_2b8;
  Span<const_unsigned_char> local_2a8;
  Bytes local_298;
  undefined1 local_288 [8];
  AssertionResult gtest_ar;
  string local_270;
  AssertHelper local_250;
  Message local_248;
  int local_23c;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_;
  uint8_t computed [32];
  undefined1 local_200 [8];
  SHA256_CTX ctx;
  size_t secret_len;
  uint8_t expected [32];
  ScopedTrace local_159;
  undefined4 uStack_158;
  undefined4 uStack_154;
  ScopedTrace gtest_trace_604;
  size_t len;
  ScopedTrace local_139;
  ulong uStack_138;
  ScopedTrace gtest_trace_602;
  size_t max_len;
  ulong uStack_128;
  ScopedTrace gtest_trace_598;
  size_t prefix;
  size_t kSkip;
  uint8_t buf [256];
  CipherTest_SHA256WithSecretSuffix_Test *this_local;
  
  RAND_bytes((uchar *)&kSkip,0x100);
  uStack_128 = 0;
  do {
    if (0x3f < uStack_128) {
      return;
    }
    testing::ScopedTrace::ScopedTrace<unsigned_long>
              ((ScopedTrace *)((long)&max_len + 7),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x256,&stack0xfffffffffffffed8);
    for (uStack_138 = 0; uStack_138 < 0xc0; uStack_138 = uStack_138 + 3) {
      testing::ScopedTrace::ScopedTrace<unsigned_long>
                (&local_139,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x25a,&stack0xfffffffffffffec8);
      for (_uStack_158 = 0; _uStack_158 <= uStack_138; _uStack_158 = _uStack_158 + 3) {
        testing::ScopedTrace::ScopedTrace<unsigned_long>
                  (&local_159,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0x25c,(unsigned_long *)&stack0xfffffffffffffea8);
        SHA256((uchar *)&kSkip,uStack_128 + _uStack_158,(uchar *)&secret_len);
        ctx.num = uStack_158;
        ctx.md_len = uStack_154;
        SHA256_Init((SHA256_CTX *)local_200);
        SHA256_Update((SHA256_CTX *)local_200,&kSkip,uStack_128);
        local_23c = EVP_sha256_final_with_secret_suffix
                              ((SHA256_CTX *)local_200,(uint8_t *)&gtest_ar_.message_,
                               buf + (uStack_128 - 8),ctx._104_8_,uStack_138);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_238,&local_23c,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
        if (!bVar1) {
          testing::Message::Message(&local_248);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_270,(internal *)local_238,
                     (AssertionResult *)
                     "EVP_sha256_final_with_secret_suffix( &ctx, computed, buf + prefix, secret_len, max_len)"
                     ,"false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_250,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0x26b,pcVar2);
          testing::internal::AssertHelper::operator=(&local_250,&local_248);
          testing::internal::AssertHelper::~AssertHelper(&local_250);
          std::__cxx11::string::~string((string *)&local_270);
          testing::Message::~Message(&local_248);
        }
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
        if (gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          bssl::Span<unsigned_char_const>::Span<32ul>
                    ((Span<unsigned_char_const> *)&local_2a8,(uchar (*) [32])&secret_len);
          Bytes::Bytes(&local_298,local_2a8);
          bssl::Span<unsigned_char_const>::Span<32ul>
                    ((Span<unsigned_char_const> *)&local_2c8,(uchar (*) [32])&gtest_ar_.message_);
          Bytes::Bytes(&local_2b8,local_2c8);
          testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                    ((EqHelper *)local_288,"Bytes(expected)","Bytes(computed)",&local_298,&local_2b8
                    );
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
          if (!bVar1) {
            testing::Message::Message(&local_2d0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
            testing::internal::AssertHelper::AssertHelper
                      (&local_2d8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0x26e,pcVar2);
            testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
            testing::internal::AssertHelper::~AssertHelper(&local_2d8);
            testing::Message::~Message(&local_2d0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ = 0;
        }
        testing::ScopedTrace::~ScopedTrace(&local_159);
        if (gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ != 0) goto LAB_002d8d2c;
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
LAB_002d8d2c:
      testing::ScopedTrace::~ScopedTrace(&local_139);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_002d8d75;
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
LAB_002d8d75:
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&max_len + 7));
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) {
      return;
    }
    uStack_128 = uStack_128 + 3;
  } while( true );
}

Assistant:

TEST(CipherTest, SHA256WithSecretSuffix) {
  uint8_t buf[SHA256_CBLOCK * 4];
  RAND_bytes(buf, sizeof(buf));
  // Hashing should run in time independent of the bytes.
  CONSTTIME_SECRET(buf, sizeof(buf));

  // Exhaustively testing interesting cases in this function is cubic in the
  // block size, so we test in 3-byte increments.
  constexpr size_t kSkip = 3;
  // This value should be less than 8 to test the edge case when the 8-byte
  // length wraps to the next block.
  static_assert(kSkip < 8, "kSkip is too large");

  // |EVP_sha256_final_with_secret_suffix| is sensitive to the public length of
  // the partial block previously hashed. In TLS, this is the HMAC prefix, the
  // header, and the public minimum padding length.
  for (size_t prefix = 0; prefix < SHA256_CBLOCK; prefix += kSkip) {
    SCOPED_TRACE(prefix);
    // The first block is treated differently, so we run with up to three
    // blocks of length variability.
    for (size_t max_len = 0; max_len < 3 * SHA256_CBLOCK; max_len += kSkip) {
      SCOPED_TRACE(max_len);
      for (size_t len = 0; len <= max_len; len += kSkip) {
        SCOPED_TRACE(len);

        uint8_t expected[SHA256_DIGEST_LENGTH];
        SHA256(buf, prefix + len, expected);
        CONSTTIME_DECLASSIFY(expected, sizeof(expected));

        // Make a copy of the secret length to avoid interfering with the loop.
        size_t secret_len = len;
        CONSTTIME_SECRET(&secret_len, sizeof(secret_len));

        SHA256_CTX ctx;
        SHA256_Init(&ctx);
        SHA256_Update(&ctx, buf, prefix);
        uint8_t computed[SHA256_DIGEST_LENGTH];
        ASSERT_TRUE(EVP_sha256_final_with_secret_suffix(
            &ctx, computed, buf + prefix, secret_len, max_len));

        CONSTTIME_DECLASSIFY(computed, sizeof(computed));
        EXPECT_EQ(Bytes(expected), Bytes(computed));
      }
    }
  }
}